

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fxtract_x86_64(CPUX86State *env)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  int iVar4;
  floatx80 fVar5;
  floatx80 a;
  floatx80 a_00;
  floatx80 b;
  undefined6 uStack_6e;
  int expdif;
  undefined6 uStack_46;
  floatx80 one;
  floatx80 zero;
  CPU_LDoubleU temp;
  CPUX86State *env_local;
  
  uVar2 = env->fpregs[env->fpstt].d.low;
  uVar3 = *(ulong *)((long)(env->fpregs + env->fpstt) + 8);
  fVar5._10_6_ = 0;
  fVar5._0_10_ = *(unkuint10 *)(env->fpregs + env->fpstt);
  iVar4 = floatx80_is_zero(fVar5);
  if (iVar4 == 0) {
    temp.d.low._0_2_ = (undefined2)uVar3;
    uVar1 = env->fpstt;
    fVar5 = int32_to_floatx80_x86_64(((ushort)temp.d.low._0_2_ & 0x7fff) - 0x3fff,&env->fp_status);
    env->fpregs[uVar1].d.low = fVar5.low;
    *(ulong *)((long)(env->fpregs + uVar1) + 8) = CONCAT62(uStack_6e,fVar5.high);
    fpush(env);
    temp.d.low = uVar3 & 0xffffffffffff8000 | 0x3fff;
    uVar1 = env->fpstt;
    env->fpregs[uVar1].d.low = uVar2;
    *(uint64_t *)((long)(env->fpregs + uVar1) + 8) = temp.d.low;
  }
  else {
    memset(&one.high,0,0x10);
    one.low._0_2_ = 0x3fff;
    one.low._2_6_ = 0;
    uVar1 = env->fpstt;
    a.high = 0x3fff;
    a.low = 0x8000000000000000;
    a._10_6_ = 0;
    fVar5 = floatx80_chs(a);
    a_00._10_6_ = 0;
    a_00.low = (long)fVar5._0_10_;
    a_00.high = (short)(fVar5._0_10_ >> 0x40);
    b._10_6_ = 0;
    b.low = one._8_8_;
    b.high = (undefined2)zero.low;
    fVar5 = floatx80_div_x86_64(a_00,b,&env->fp_status);
    env->fpregs[uVar1].d.low = fVar5.low;
    *(ulong *)((long)(env->fpregs + uVar1) + 8) = CONCAT62(uStack_46,fVar5.high);
    fpush(env);
    uVar1 = env->fpstt;
    env->fpregs[uVar1].d.low = uVar2;
    *(ulong *)((long)(env->fpregs + uVar1) + 8) = uVar3;
  }
  return;
}

Assistant:

void helper_fxtract(CPUX86State *env)
{
    CPU_LDoubleU temp;

    temp.d = ST0;

    if (floatx80_is_zero(ST0)) {
        /* Easy way to generate -inf and raising division by 0 exception */
        floatx80 zero = { 0x0000000000000000LL, 0x0000 };
        floatx80 one  = { 0x8000000000000000LL, 0x3fff };
        ST0 = floatx80_div(floatx80_chs(one), zero,
                           &env->fp_status);
        fpush(env);
        ST0 = temp.d;
    } else {
        int expdif;

        expdif = EXPD(temp) - EXPBIAS;
        /* DP exponent bias */
        ST0 = int32_to_floatx80(expdif, &env->fp_status);
        fpush(env);
        BIASEXPONENT(temp);
        ST0 = temp.d;
    }
}